

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

JumpAnnotation * __thiscall asmjit::_abi_1_10::BaseCompiler::newJumpAnnotation(BaseCompiler *this)

{
  ZoneAllocator *allocator;
  Error EVar1;
  JumpAnnotation *jumpAnnotation;
  uint32_t id;
  
  allocator = &(this->super_BaseBuilder)._allocator;
  EVar1 = ZoneVector<asmjit::_abi_1_10::JumpAnnotation_*>::grow(&this->_jumpAnnotations,allocator,1)
  ;
  if (EVar1 == 0) {
    id = (this->_jumpAnnotations).super_ZoneVectorBase._size;
    jumpAnnotation = (JumpAnnotation *)this;
    jumpAnnotation =
         ZoneAllocator::
         newT<asmjit::_abi_1_10::JumpAnnotation,asmjit::_abi_1_10::BaseCompiler*,unsigned_int&>
                   (allocator,(BaseCompiler **)&jumpAnnotation,&id);
    if (jumpAnnotation != (JumpAnnotation *)0x0) {
      ZoneVector<asmjit::_abi_1_10::JumpAnnotation_*>::appendUnsafe
                (&this->_jumpAnnotations,&jumpAnnotation);
      return jumpAnnotation;
    }
  }
  BaseEmitter::reportError((BaseEmitter *)this,1,(char *)0x0);
  return (JumpAnnotation *)0x0;
}

Assistant:

JumpAnnotation* BaseCompiler::newJumpAnnotation() {
  if (_jumpAnnotations.grow(&_allocator, 1) != kErrorOk) {
    reportError(DebugUtils::errored(kErrorOutOfMemory));
    return nullptr;
  }

  uint32_t id = _jumpAnnotations.size();
  JumpAnnotation* jumpAnnotation = _allocator.newT<JumpAnnotation>(this, id);

  if (!jumpAnnotation) {
    reportError(DebugUtils::errored(kErrorOutOfMemory));
    return nullptr;
  }

  _jumpAnnotations.appendUnsafe(jumpAnnotation);
  return jumpAnnotation;
}